

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void log_write(int level,char *fmt,...)

{
  int __fd;
  char in_AL;
  size_t __n;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *in_RSI;
  int in_EDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  char buf [512];
  undefined1 local_2e8 [16];
  undefined8 local_2d8;
  undefined8 local_2d0;
  undefined8 local_2c8;
  undefined8 local_2c0;
  undefined8 local_2b8;
  undefined8 local_2a8;
  undefined8 local_298;
  undefined8 local_288;
  undefined8 local_278;
  undefined8 local_268;
  undefined8 local_258;
  undefined8 local_248;
  undefined4 local_238;
  undefined4 local_234;
  undefined1 *local_230;
  undefined1 *local_228;
  char local_218 [511];
  undefined1 local_19;
  char *local_10;
  int local_4;
  
  if (in_AL != '\0') {
    local_2b8 = in_XMM0_Qa;
    local_2a8 = in_XMM1_Qa;
    local_298 = in_XMM2_Qa;
    local_288 = in_XMM3_Qa;
    local_278 = in_XMM4_Qa;
    local_268 = in_XMM5_Qa;
    local_258 = in_XMM6_Qa;
    local_248 = in_XMM7_Qa;
  }
  if ((in_EDI <= log_level) && (-1 < log_fd)) {
    local_228 = local_2e8;
    local_230 = &stack0x00000008;
    local_234 = 0x30;
    local_238 = 0x10;
    local_2d8 = in_RDX;
    local_2d0 = in_RCX;
    local_2c8 = in_R8;
    local_2c0 = in_R9;
    local_10 = in_RSI;
    local_4 = in_EDI;
    vsnprintf(local_218,0x200,in_RSI,&local_238);
    __fd = log_fd;
    local_19 = 0;
    __n = strlen(local_218);
    write(__fd,local_218,__n);
  }
  return;
}

Assistant:

void log_write(int level, const char *fmt, ...)
{
    char buf[LOG_BUF_MAX];
    va_list ap;
    
    if (level > log_level) return;
    if (log_fd < 0) return;
    
    va_start(ap, fmt);
    vsnprintf(buf, LOG_BUF_MAX, fmt, ap);
    buf[LOG_BUF_MAX - 1] = 0;
    va_end(ap);
    write(log_fd, buf, strlen(buf));
}